

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O1

MPP_RET hal_h264e_vepu580_gen_regs(void *hal,HalEncTask *task)

{
  byte bVar1;
  ushort uVar2;
  MppFrameFormat format;
  void *__s;
  int *piVar3;
  long lVar4;
  MppDevRegOffCfgs *cfgs;
  MppPacket s;
  MppFrame frame;
  MppBuffer pvVar5;
  undefined8 *puVar6;
  HalBufs bufs;
  long *plVar7;
  long *plVar8;
  short sVar9;
  MPP_RET MVar10;
  uint uVar11;
  uint uVar12;
  RK_S32 RVar13;
  RK_U32 RVar14;
  RK_U32 RVar15;
  int iVar16;
  RK_U32 offset;
  VepuRgb2YuvCfg *pVVar17;
  MppBuffer pvVar18;
  undefined4 extraout_var;
  size_t sVar19;
  HalBuf *pHVar20;
  HalBuf *pHVar21;
  void *pvVar22;
  ushort *ptr;
  long lVar23;
  undefined2 uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  Vepu541Fmt VVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  char *fmt;
  int iVar34;
  int iVar35;
  uint uVar36;
  RK_U32 *pRVar37;
  RK_U32 *pRVar38;
  short sVar39;
  ulong uVar40;
  uint uVar41;
  int iVar42;
  undefined8 uVar43;
  bool bVar44;
  byte bVar45;
  VepuFmtCfg cfg;
  VepuFmtCfg local_80;
  undefined8 local_58;
  long local_50;
  EncRcTask *local_48;
  MppFrameFormat local_3c;
  size_t local_38;
  
  bVar45 = 0;
  __s = *(void **)((long)hal + 0x1d0);
  lVar31 = *hal;
  piVar3 = *(int **)((long)hal + 0x60);
  lVar23 = *(long *)((long)hal + 0x68);
  lVar4 = *(long *)((long)hal + 0x1e8);
  local_48 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  if (((byte)hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","frame %d generate regs now","hal_h264e_vepu580_gen_regs",
               (ulong)**(uint **)((long)hal + 0x78));
  }
  memset(__s,0,0x1cb8);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_normal");
  }
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffc00 | 0x100;
  *(byte *)((long)__s + 0x54) = *(byte *)((long)__s + 0x54) | 7;
  *(byte *)((long)__s + 0x14) = *(byte *)((long)__s + 0x14) & 0xfc;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffe00 | 0x1f7;
  *(uint *)((long)__s + 0x24) = *(uint *)((long)__s + 0x24) & 0xfffffe00;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xf0000001 | 0x8007000;
  *(uint *)((long)__s + 0x34) = *(uint *)((long)__s + 0x34) & 0xff00ff7f | 0x80;
  local_50 = lVar31;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_normal");
  }
  lVar31 = *hal;
  format = *(MppFrameFormat *)(lVar31 + 0x24);
  MVar10 = vepu541_set_fmt(&local_80,format);
  uVar43 = local_80._0_8_;
  VVar29 = local_80.format;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_prep");
  }
  if (MVar10 != MPP_OK) {
    return MVar10;
  }
  uVar11 = (*(int *)(lVar31 + 0xc) + 0xfU >> 3 & 0x7fe) - 1 & 0x7ff;
  uVar12 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar12 & 0xfffff800 | uVar11;
  uVar36 = (*(int *)(lVar31 + 0xc) + 0xfU & 0x30) - *(int *)(lVar31 + 0xc) & 0x3f;
  uVar25 = *(uint *)((long)__s + 0xf4);
  *(uint *)((long)__s + 0xf4) = uVar25 & 0xffffffc0 | uVar36;
  *(uint *)((long)__s + 0xf0) =
       uVar12 & 0xf800f800 | uVar11 |
       (*(int *)(lVar31 + 0x10) * 0x2000 + 0x1e000U & 0x7fe0000) + 0x7ff0000 & 0x7ff0000;
  *(uint *)((long)__s + 0xf4) =
       uVar25 & 0xffc0ffc0 | uVar36 |
       ((*(int *)(lVar31 + 0x10) + 0xfU & 0x30) - *(int *)(lVar31 + 0x10) & 0x3f) << 0x10;
  *(uint *)((long)__s + 0x30) =
       *(uint *)((long)__s + 0x30) & 0xffffff0f | (local_80.src_endian & 0xf) << 4;
  uVar12 = (*(uint *)((long)__s + 0xf8) & 0xffffffc3) +
           (VVar29 & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) * 4;
  *(uint *)((long)__s + 0xf8) = uVar12;
  *(uint *)((long)__s + 0xf8) = uVar12 & 0xfffffffe | local_80.alpha_swap & 1;
  uVar12 = ((uint)(format != MPP_FMT_YUV400) << 7 | uVar12 & 0xffffff7c | local_80.alpha_swap & 1) +
           (local_80.rbuv_swap & 1) * 2;
  *(uint *)((long)__s + 0xf8) = uVar12;
  if ((format & 0xfffc) < MPP_FMT_YUV_BUTT && (format & 0xf0000) == MPP_FMT_YUV420SP) {
    uVar12 = uVar12 | 0x40;
  }
  else {
    uVar12 = uVar12 & 0xffffffbf | (uint)(*(int *)(lVar31 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar12;
  if ((format & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar12 = *(uint *)(lVar31 + 0x14);
    if (uVar12 == 0) {
      switch(uVar43 & 0xffffffff) {
      case 0:
        uVar12 = *(int *)(lVar31 + 0xc) << 2;
        break;
      case 1:
        uVar12 = *(int *)(lVar31 + 0xc) * 3;
        break;
      case 2:
      case 8:
      case 9:
        uVar12 = *(int *)(lVar31 + 0xc) * 2;
        break;
      default:
        uVar12 = *(uint *)(lVar31 + 0xc);
      }
    }
  }
  else {
    uVar12 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar12 == 0) {
      uVar12 = *(int *)(lVar31 + 0xc) + 0xfU & 0xfffffff0;
    }
  }
  sVar39 = (short)uVar12;
  switch(VVar29) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
  case VEPU580_FMT_YUV444P:
    break;
  default:
    sVar39 = (short)((int)uVar12 / 2);
    break;
  case VEPU580_FMT_YUV444SP:
    sVar39 = sVar39 * 2;
  }
  if (VVar29 < VEPU541_FMT_NONE) {
    pVVar17 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar31 + 0x34),
                              *(MppFrameColorSpace *)(lVar31 + 0x28));
    if (((byte)hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","input color range %d colorspace %d","setup_vepu580_prep",
                 (ulong)*(uint *)(lVar31 + 0x34),(ulong)*(uint *)(lVar31 + 0x28));
    }
    uVar11 = (ushort)(pVVar17->_2y).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = ((ushort)(pVVar17->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0xfc) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | ((ushort)(pVVar17->_2y).r_coeff & 0x1ff) << 0x12;
    uVar11 = (ushort)(pVVar17->_2u).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0x100);
    *(uint *)((long)__s + 0x100) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = ((ushort)(pVVar17->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x100) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0x100) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | ((ushort)(pVVar17->_2u).r_coeff & 0x1ff) << 0x12;
    uVar11 = (ushort)(pVVar17->_2v).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0x104);
    *(uint *)((long)__s + 0x104) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = ((ushort)(pVVar17->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x104) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0x104) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | ((ushort)(pVVar17->_2v).r_coeff & 0x1ff) << 0x12;
    uVar11 = ((ushort)(pVVar17->_2y).offset & 0x1f) << 0x10;
    uVar25 = *(uint *)((long)__s + 0x108);
    *(uint *)((long)__s + 0x108) = uVar25 & 0xffe0ffff | uVar11;
    uVar25 = uVar25 & 0xffe000ff | uVar11 | ((ushort)(pVVar17->_2u).offset & 0xff) << 8;
    *(uint *)((long)__s + 0x108) = uVar25;
    *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar25 >> 8),(char)(pVVar17->_2v).offset);
    if (((byte)hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","use color range %d colorspace %d","setup_vepu580_prep",
                 (ulong)pVVar17->dst_range,(ulong)pVVar17->color);
    }
  }
  else {
    uVar11 = *local_80.weight & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = (local_80.weight[1] & 0x1ffU) << 9;
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0xfc) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | (local_80.weight[2] & 0x1ffU) << 0x12;
    uVar11 = local_80.weight[3] & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0x100);
    *(uint *)((long)__s + 0x100) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = (local_80.weight[4] & 0x1ffU) << 9;
    *(uint *)((long)__s + 0x100) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0x100) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | (local_80.weight[5] & 0x1ffU) << 0x12;
    uVar11 = local_80.weight[6] & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0x104);
    *(uint *)((long)__s + 0x104) = uVar25 & 0xfffffe00 | uVar11;
    uVar36 = (local_80.weight[7] & 0x1ffU) << 9;
    *(uint *)((long)__s + 0x104) = uVar25 & 0xfffc0000 | uVar11 | uVar36;
    *(uint *)((long)__s + 0x104) =
         uVar25 & 0xf8000000 | uVar11 | uVar36 | (local_80.weight[8] & 0x1ffU) << 0x12;
    uVar11 = (*local_80.offset & 0x1fU) << 0x10;
    uVar25 = *(uint *)((long)__s + 0x108);
    *(uint *)((long)__s + 0x108) = uVar25 & 0xffe0ffff | uVar11;
    uVar25 = uVar25 & 0xffe000ff | uVar11 | (local_80.offset[1] & 0xffU) << 8;
    *(uint *)((long)__s + 0x108) = uVar25;
    *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar25 >> 8),(char)local_80.offset[2]);
  }
  uVar11 = (uint)((format & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  uVar25 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar25 & 0xbfffffff | uVar11;
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | uVar12 & 0x1ffff;
  *(short *)((long)__s + 0x118) = sVar39;
  uVar12 = (uint)(0 < *(int *)(lVar31 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar25 & 0xbbffffff | uVar11 | uVar12;
  *(uint *)((long)__s + 0x10c) =
       uVar25 & 0x83ffffff | uVar11 | uVar12 | (*(uint *)(lVar31 + 0x50) & 3) << 0x1b;
  *(byte *)((long)__s + 0x1d3) = *(byte *)((long)__s + 0x1d3) | 0x80;
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xc000c000;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_prep");
  }
  if (*(int *)((long)hal + 0x14) != 1) {
    lVar31 = *(long *)((long)hal + 0x1d0);
    uVar12 = 0x90030;
    if (*(int *)(lVar4 + 0x2c) == 2) {
      *(undefined8 *)((long)hal + 0x1c4) = 0;
      uVar12 = 0x90010;
    }
    uVar25 = *(uint *)(lVar31 + 0xe4);
    uVar11 = *(uint *)((long)hal + 0x1c4) & 3;
    *(uint *)(lVar31 + 0xe4) = uVar25 & 0xfffffffc | uVar11;
    *(uint *)(lVar31 + 0xe4) =
         (uVar25 & 0xf800ffc0 | uVar11 | uVar12) + (*(uint *)((long)hal + 0x1c8) & 3) * 4;
    iVar30 = *(int *)((long)hal + 0x1c4);
    *(int *)((long)hal + 0x1c4) = iVar30 + 1;
    *(int *)((long)hal + 0x1c8) = iVar30;
    if (2 < iVar30) {
      *(undefined4 *)((long)hal + 0x1c4) = 0;
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_codec");
  }
  uVar12 = *(uint *)((long)__s + 0xe0);
  uVar25 = *(uint *)((long)__s + 400);
  *(uint *)((long)__s + 0xe0) = uVar12 & 0xfffffffe;
  *(uint *)((long)__s + 0xe0) =
       (uVar12 & 0xffffffea) + (uint)(0 < *(int *)(lVar4 + 0x20)) * 4 + 0x10;
  uVar12 = *(uint *)(lVar4 + 0x20) & 3;
  *(uint *)((long)__s + 400) = uVar25 & 0xfffffffc | uVar12;
  *(uint *)((long)__s + 400) = (uVar25 & 0xffffff80 | uVar12) + (*(uint *)(lVar4 + 0x24) & 0x1f) * 4
  ;
  uVar12 = *(uint *)((long)__s + 0x194);
  uVar25 = piVar3[10] & 0xf;
  *(uint *)((long)__s + 0x194) = uVar12 & 0xfffffff0 | uVar25;
  uVar11 = (piVar3[0x12] & 1U) << 4;
  *(uint *)((long)__s + 0x194) = uVar12 & 0xffffffe0 | uVar25 | uVar11;
  *(uint *)((long)__s + 0x194) = uVar12 & 0xfffffe00 | uVar25 | uVar11 | (piVar3[0xc] & 0xfU) << 5;
  uVar12 = *(uint *)((long)__s + 0x198);
  uVar25 = *(uint *)(lVar23 + 8) & 1;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xfffffffe | uVar25;
  uVar12 = (uVar12 & 0xfffffffc | uVar25) + (*(uint *)(lVar23 + 0x44) & 1) * 2;
  *(uint *)((long)__s + 0x198) = uVar12;
  uVar12 = (uVar12 & 0xfffffffb) + (*(uint *)(lVar23 + 0x3c) & 1) * 4;
  *(uint *)((long)__s + 0x198) = uVar12;
  uVar25 = *(int *)(lVar23 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xffffffe7 | uVar25;
  uVar11 = *(int *)(lVar23 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xffffff87 | uVar25 | uVar11;
  uVar36 = (*(uint *)(lVar23 + 0x24) & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xffffe007 | uVar25 | uVar11 | uVar36;
  uVar26 = (*(uint *)(lVar23 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xfffc0007 | uVar25 | uVar11 | uVar36 | uVar26;
  uVar27 = (*(uint *)(lVar23 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)__s + 0x198) = uVar12 & 0xff800007 | uVar25 | uVar11 | uVar36 | uVar26 | uVar27;
  uVar28 = (*(uint *)(lVar23 + 0x1c) & 1) << 0x17;
  *(uint *)((long)__s + 0x198) =
       uVar12 & 0xff000007 | uVar25 | uVar11 | uVar36 | uVar26 | uVar27 | uVar28;
  *(uint *)((long)__s + 0x198) =
       uVar12 & 0xfe000007 | uVar25 | uVar11 | uVar36 | uVar26 | uVar27 | uVar28 |
       (*(uint *)(lVar23 + 0x38) & 1) << 0x18;
  uVar12 = (*(uint *)((long)__s + 0x19c) & 0xfffffffc) + (uint)(*(int *)(lVar4 + 0x2c) == 2) * 2;
  *(uint *)((long)__s + 0x19c) = uVar12;
  uVar12 = (uVar12 & 0xfffff802) + (*(uint *)(lVar4 + 0x30) & 0xff) * 4;
  *(uint *)((long)__s + 0x19c) = uVar12;
  uVar25 = (*(uint *)(lVar4 + 0x38) & 1) << 0xb;
  *(uint *)((long)__s + 0x19c) = uVar12 & 0xfffff3fe | uVar25;
  uVar11 = (*(uint *)(lVar4 + 0x40) & 3) << 0xc;
  *(uint *)((long)__s + 0x19c) = uVar12 & 0xffffc3fe | uVar25 | uVar11;
  *(uint *)((long)__s + 0x19c) = uVar12 & 0xc3fe | uVar25 | uVar11 | *(int *)(lVar4 + 0x34) << 0x10;
  uVar12 = 0xffff;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar12 = (uint)*(ushort *)(lVar4 + 0x6c);
  }
  *(short *)((long)__s + 0x1a0) = (short)uVar12;
  *(uint *)((long)__s + 0x1a0) = *(int *)(lVar4 + 0x74) << 0x10 | uVar12;
  uVar25 = (*(uint *)(lVar4 + 0x44) & 3) << 0xb;
  uVar12 = *(uint *)((long)__s + 0x1a4);
  *(uint *)((long)__s + 0x1a4) = uVar12 & 0xffffe7ff | uVar25;
  *(uint *)((long)__s + 0x1a4) = uVar12 & 0xffffe07f | uVar25 | (*(uint *)(lVar4 + 0x48) & 0xf) << 7
  ;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar4 + 0x58));
  MVar10 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar4 + 0x58),(H264eRplmo *)&local_80);
  VVar29 = *(Vepu541Fmt *)((long)__s + 0x1a4);
  if (MVar10 == MPP_OK) {
    *(Vepu541Fmt *)((long)__s + 0x1a4) = VVar29 | VEPU541_FMT_YUV422SP;
    *(Vepu541Fmt *)((long)__s + 0x1a4) =
         VVar29 & ~VEPU541_FMT_NONE | VEPU541_FMT_YUV422SP | local_80.format & VEPU541_FMT_NONE;
    if (local_80.format < VEPU541_FMT_BGR565) {
      RVar14 = local_80.alpha_swap;
LAB_00222ea1:
      VVar29 = VVar29 & 0xfffc | VEPU541_FMT_YUV422SP | local_80.format & VEPU541_FMT_NONE |
               RVar14 << 0x10;
      goto LAB_00222ea9;
    }
    RVar14 = local_80.rbuv_swap;
    if (local_80.format == VEPU541_FMT_BGR565) goto LAB_00222ea1;
    _mpp_log_l(2,"hal_h264e_vepu580","invalid modification_of_pic_nums_idc %d\n",
               "setup_vepu580_codec");
  }
  else {
    VVar29 = VVar29 & 0xfff8;
LAB_00222ea9:
    *(Vepu541Fmt *)((long)__s + 0x1a4) = VVar29;
  }
  *(uint *)((long)__s + 0x1a8) = *(uint *)((long)__s + 0x1a8) & 0xe0000000;
  *(undefined4 *)((long)__s + 0x1ac) = 0;
  *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar4 + 0x60));
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar12 = *(uint *)((long)__s + 0x1a8);
    uVar25 = *(uint *)(lVar4 + 0x7c) & 1;
    *(uint *)((long)__s + 0x1a8) = uVar12 & 0xfffffffe | uVar25;
    *(uint *)((long)__s + 0x1a8) =
         (uVar12 & 0xfffffffc | uVar25) + (*(uint *)(lVar4 + 0x80) & 1) * 2;
  }
  else {
    RVar13 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
    if (RVar13 == 0) {
      *(byte *)((long)__s + 0x1a8) = *(byte *)((long)__s + 0x1a8) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
      uVar25 = 0;
      uVar12 = 0;
      RVar14 = local_80.alpha_swap;
      switch(local_80.format) {
      case VEPU541_FMT_BGR888:
        uVar11 = 0x10;
        break;
      case VEPU541_FMT_BGR565:
        uVar11 = 0x20;
        RVar14 = local_80.rbuv_swap;
        break;
      case VEPU541_FMT_NONE:
        uVar12 = local_80.src_range & 0xf;
        uVar11 = 0x30;
        break;
      case VEPU541_FMT_YUV422SP:
        uVar11 = 0x40;
        uVar12 = uVar25;
        RVar14 = local_80.src_endian;
        break;
      case VEPU541_FMT_YUV422P:
        uVar11 = 0x50;
        RVar14 = 0;
        uVar12 = uVar25;
        break;
      case VEPU541_FMT_YUV420SP:
        uVar11 = 0x60;
        uVar12 = uVar25;
        RVar14 = local_80.src_range;
        break;
      default:
        uVar11 = 0;
        _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
        uVar12 = 0;
        RVar14 = 0;
      }
      *(RK_U32 *)((long)__s + 0x1a8) =
           (RVar14 & 0xffff) << 7 | uVar11 | *(uint *)((long)__s + 0x1a8) & 0xff80000f;
      *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffffff0 | uVar12;
      RVar13 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
      if (RVar13 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
        uVar25 = 0;
        uVar12 = 0;
        uVar24 = (undefined2)local_80.alpha_swap;
        switch(local_80.format) {
        case VEPU541_FMT_BGR888:
          uVar11 = 0x800000;
          break;
        case VEPU541_FMT_BGR565:
          uVar11 = 0x1000000;
          uVar24 = (undefined2)local_80.rbuv_swap;
          break;
        case VEPU541_FMT_NONE:
          uVar12 = (local_80.src_range & 0xf) << 4;
          uVar11 = 0x1800000;
          break;
        case VEPU541_FMT_YUV422SP:
          uVar11 = 0x2000000;
          uVar12 = uVar25;
          uVar24 = (undefined2)local_80.src_endian;
          break;
        case VEPU541_FMT_YUV422P:
          uVar11 = 0x2800000;
          uVar24 = 0;
          uVar12 = uVar25;
          break;
        case VEPU541_FMT_YUV420SP:
          uVar11 = 0x3000000;
          uVar12 = uVar25;
          uVar24 = (undefined2)local_80.src_range;
          break;
        default:
          uVar11 = 0;
          _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
          uVar12 = 0;
          uVar24 = 0;
        }
        *(uint *)((long)__s + 0x1a8) = *(uint *)((long)__s + 0x1a8) & 0xfc7fffff | uVar11;
        *(undefined2 *)((long)__s + 0x1ac) = uVar24;
        *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xffffff0f | uVar12;
        RVar13 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar4 + 0x60));
        if (RVar13 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar4 + 0x60),(H264eMmco *)&local_80);
          uVar25 = 0;
          uVar12 = 0;
          uVar24 = (undefined2)local_80.alpha_swap;
          switch(local_80.format) {
          case VEPU541_FMT_BGR888:
            uVar11 = 0x4000000;
            break;
          case VEPU541_FMT_BGR565:
            uVar11 = 0x8000000;
            uVar24 = (undefined2)local_80.rbuv_swap;
            break;
          case VEPU541_FMT_NONE:
            uVar12 = (local_80.src_range & 0xf) << 8;
            uVar11 = 0xc000000;
            break;
          case VEPU541_FMT_YUV422SP:
            uVar11 = 0x10000000;
            uVar12 = uVar25;
            uVar24 = (undefined2)local_80.src_endian;
            break;
          case VEPU541_FMT_YUV422P:
            uVar11 = 0x14000000;
            uVar24 = 0;
            uVar12 = uVar25;
            break;
          case VEPU541_FMT_YUV420SP:
            uVar11 = 0x18000000;
            uVar12 = uVar25;
            uVar24 = (undefined2)local_80.src_range;
            break;
          default:
            uVar11 = 0;
            _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
            uVar12 = 0;
            uVar24 = 0;
          }
          *(uint *)((long)__s + 0x1a8) = *(uint *)((long)__s + 0x1a8) & 0xe3ffffff | uVar11;
          *(undefined2 *)((long)__s + 0x1ae) = uVar24;
          *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff0ff | uVar12;
        }
      }
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_codec");
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_pred");
  }
  uVar12 = *(uint *)((long)__s + 600) & 0xfffffff8;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    *(uint *)((long)__s + 600) = uVar12;
    pRVar37 = h264e_klut_weight;
  }
  else {
    *(uint *)((long)__s + 600) = uVar12 | 3;
    pRVar37 = h264e_klut_weight + 4;
  }
  pRVar38 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar31 = 0x18; lVar31 != 0; lVar31 = lVar31 + -1) {
    *pRVar38 = *pRVar37;
    pRVar37 = pRVar37 + (ulong)bVar45 * -2 + 1;
    pRVar38 = pRVar38 + (ulong)bVar45 * -2 + 1;
  }
  *(uint *)((long)__s + 0x184) = *(uint *)((long)__s + 0x184) & 0xf000f000 | 0x3f0009;
  uVar12 = 2;
  if (*piVar3 == 0x42) {
    uVar12 = piVar3[7] < 0x1f | 2;
  }
  uVar25 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar25 & 0xfffffffc | uVar12;
  iVar30 = 0;
  if (*piVar3 < 0x4d) {
    iVar30 = (uint)(*(int *)(lVar23 + 8) == 0) << 3;
  }
  uVar12 = (uVar25 & 0xffffc004 | uVar12) + iVar30 + 0x2010;
  *(uint *)((long)__s + 0x180) = uVar12;
  *(uint *)((long)__s + 0x180) =
       (uVar12 & 0xffc7601f) + (*(uint *)(lVar23 + 0x48) & 3) * 0x100000 + 0x88000;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_pred");
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_cfg");
  }
  *(byte *)((long)__s + 0x58c) = *(byte *)((long)__s + 0x58c) | 1;
  *(uint *)((long)__s + 0x658) = *(uint *)((long)__s + 0x658) & 0xf000f000 | 0x2c001c;
  *(uint *)((long)__s + 0x65c) = *(uint *)((long)__s + 0x65c) & 0xfffff000 | 0x48;
  *(uint *)((long)__s + 0x660) = *(uint *)((long)__s + 0x660) & 0xf000f000 | 0x400019;
  *(uint *)((long)__s + 0x664) = *(uint *)((long)__s + 0x664) & 0xf000f000 | 0x400019;
  *(uint *)((long)__s + 0x668) = *(uint *)((long)__s + 0x668) & 0xf000f000 | 0x640046;
  *(uint *)((long)__s + 0x66c) = *(uint *)((long)__s + 0x66c) & 0xf000f000 | 0x640046;
  *(uint *)((long)__s + 0x670) = (uint)*(byte *)((long)__s + 0x673) << 0x18 | 0x151618;
  *(uint *)((long)__s + 0x674) = (uint)*(byte *)((long)__s + 0x677) << 0x18 | 0x141516;
  *(uint *)((long)__s + 0x678) = (uint)*(byte *)((long)__s + 0x67b) << 0x18 | 0x121314;
  *(uint *)((long)__s + 0x67c) = (uint)*(byte *)((long)__s + 0x67f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x6a8) = *(uint *)((long)__s + 0x6a8) & 0xf000f000 | 0x8000a;
  *(uint *)((long)__s + 0x6ac) = *(uint *)((long)__s + 0x6ac) & 0xf000f000 | 0x19000f;
  *(uint *)((long)__s + 0x6b0) = *(uint *)((long)__s + 0x6b0) & 0xf000f000 | 0x280019;
  *(uint *)((long)__s + 0x6b4) = *(uint *)((long)__s + 0x6b4) & 0xf000f000 | 0x280019;
  *(uint *)((long)__s + 0x6b8) = *(uint *)((long)__s + 0x6b8) & 0xf000f000 | 0x640046;
  *(uint *)((long)__s + 0x6bc) = *(uint *)((long)__s + 0x6bc) & 0xf000f000 | 0x640046;
  *(undefined4 *)((long)__s + 0x6c0) = 0x10101014;
  *(uint *)((long)__s + 0x6c4) = (uint)*(byte *)((long)__s + 0x6c7) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x6c8) = (uint)*(byte *)((long)__s + 0x6cb) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x6cc) = (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | 0x101010;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_cfg");
  }
  bVar1 = (byte)h264_mode_bias[*(int *)(local_50 + 0x2a4)];
  uVar12 = 0x18;
  if (0x18 < bVar1) {
    uVar12 = (uint)bVar1;
  }
  uVar11 = (uint)bVar1;
  uVar25 = 0x16;
  if (0x16 < uVar11) {
    uVar25 = uVar11;
  }
  uVar36 = 0x15;
  if (0x15 < uVar11) {
    uVar36 = uVar11;
  }
  *(uint *)((long)__s + 0x670) =
       uVar36 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x673) << 0x18 | uVar12;
  uVar11 = (uint)bVar1;
  uVar12 = 0x14;
  if (0x14 < uVar11) {
    uVar12 = uVar11;
  }
  *(uint *)((long)__s + 0x674) =
       uVar12 << 0x10 | uVar36 << 8 | (uint)*(byte *)((long)__s + 0x677) << 0x18 | uVar25;
  uVar25 = 0x13;
  if (0x13 < uVar11) {
    uVar25 = uVar11;
  }
  uVar36 = 0x12;
  if (0x12 < uVar11) {
    uVar36 = uVar11;
  }
  *(uint *)((long)__s + 0x678) =
       uVar36 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x67b) << 0x18 | uVar12;
  *(uint *)((long)__s + 0x67c) =
       uVar11 << 0x10 | uVar11 << 8 | (uint)*(byte *)((long)__s + 0x67f) << 0x18 | (uint)bVar1;
  if (*(int *)(local_50 + 0x2c0) != 0) {
    uVar12 = *(uint *)(local_50 + 0x2c8);
    uVar11 = uVar12 & 0xff;
    uVar25 = 10;
    if ((int)*(uint *)(local_50 + 0x2c4) < 10) {
      uVar25 = *(uint *)(local_50 + 0x2c4) & 0xfff;
    }
    uVar36 = *(uint *)((long)__s + 0x6a8);
    *(uint *)((long)__s + 0x6a8) = uVar36 & 0xfffff000 | uVar25;
    uVar26 = 0x80000;
    if ((int)*(uint *)(local_50 + 0x2c4) < 8) {
      uVar26 = (*(uint *)(local_50 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x6a8) = uVar36 & 0xf000f000 | uVar25 | uVar26;
    uVar25 = 0xf;
    if ((int)*(uint *)(local_50 + 0x2c4) < 0xf) {
      uVar25 = *(uint *)(local_50 + 0x2c4) & 0xfff;
    }
    uVar36 = *(uint *)((long)__s + 0x6ac);
    *(uint *)((long)__s + 0x6ac) = uVar36 & 0xfffff000 | uVar25;
    uVar26 = 0x14;
    if (0x14 < uVar11) {
      uVar26 = uVar11;
    }
    *(uint *)((long)__s + 0x6ac) =
         uVar36 & 0xf000f000 | uVar25 | (*(uint *)(local_50 + 0x2c4) & 0xfff) << 0x10;
    uVar25 = uVar11 << 8;
    uVar36 = uVar11 << 0x10;
    *(uint *)((long)__s + 0x6c0) = uVar12 << 0x18 | uVar26 | uVar25 | uVar36;
    *(uint *)((long)__s + 0x6c4) =
         (uint)*(byte *)((long)__s + 0x6c7) << 0x18 | uVar25 | uVar36 | uVar11;
    *(uint *)((long)__s + 0x6c8) =
         (uint)*(byte *)((long)__s + 0x6cb) << 0x18 | uVar25 | uVar36 | uVar11;
    *(uint *)((long)__s + 0x6cc) =
         (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | uVar25 | uVar36 | uVar11;
  }
  memcpy((void *)((long)__s + 0x774),vepu580_540_h264_flat_scl_tab,0x900);
  lVar31 = *(long *)((long)hal + 0x1e8);
  lVar23 = *hal;
  iVar30 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  uVar12 = (local_48->info).bit_target;
  uVar25 = (local_48->info).quality_target;
  uVar11 = (local_48->info).quality_min;
  uVar36 = (local_48->info).quality_max;
  uVar26 = (int)(uVar12 << 4) / (*(int *)(*(long *)((long)hal + 0x60) + 0x40) * iVar30);
  if ((hal_h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","bittarget %d qp [%d %d %d]\n","setup_vepu580_rc_base",
               (ulong)uVar12,(ulong)uVar11,uVar25,uVar36);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rc_base");
  }
  uVar11 = uVar11 & 0x3f;
  uVar36 = uVar36 & 0x3f;
  *(uint *)((long)__s + 0x208) =
       *(uint *)((long)__s + 0x208) & 0xc0000000 | uVar11 | uVar11 << 0xc | uVar11 << 0x18 |
       uVar36 << 6 | uVar36 << 0x12;
  *(uint *)((long)__s + 0x20c) =
       uVar36 << 0x18 |
       uVar11 << 0x12 | uVar36 << 0xc | uVar11 << 6 | *(uint *)((long)__s + 0x20c) & 0xc0000000 |
       uVar36;
  *(uint *)((long)__s + 0x210) =
       *(uint *)((long)__s + 0x210) & 0xc0000000 | uVar11 | uVar11 << 0xc | uVar11 << 0x18 |
       uVar36 << 6 | uVar36 << 0x12;
  *(uint *)((long)__s + 0x214) = (*(uint *)((long)__s + 0x214) & 0x3fffffc0) + uVar36 + 0x40000000;
  if (*(int *)(lVar23 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar25 & 0x3f) << 8;
    *(uint *)((long)__s + 0x134) =
         uVar25 << 0x1a | *(uint *)((long)__s + 0x134) & 0xfffff | (uVar25 & 0x3f) << 0x14;
  }
  else {
    uVar12 = 0x50000;
    if ((int)uVar26 < 0x100000) {
      uVar12 = uVar26;
    }
    iVar34 = (int)(uVar12 * iVar30) >> 4;
    iVar16 = iVar34 * 5;
    iVar34 = iVar34 * 5 + 0xf;
    if (-1 < iVar16) {
      iVar34 = iVar16;
    }
    iVar34 = iVar34 >> 4;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar25 & 0x3f) << 8;
    *(uint *)((long)__s + 0x130) = (*(uint *)((long)__s + 0x130) & 0xff8) + iVar30 * 0x1000 + 3;
    uVar2 = *(ushort *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) =
         uVar11 << 0x1a |
         uVar36 << 0x14 |
         (*(uint *)(lVar23 + 0x17c + (ulong)(*(int *)(lVar31 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
         (uint)uVar2;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar12 & 0xfffff;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xfff00000 | 0x8000;
    *(int *)((long)__s + 0x1e0) = iVar34 * -4;
    *(int *)((long)__s + 0x1e4) = -iVar34;
    *(int *)((long)__s + 0x1e8) = iVar34;
    *(int *)((long)__s + 0x1ec) = iVar34 << 2;
    *(undefined4 *)((long)__s + 0x1f0) = 0x7fffffff;
    *(undefined4 *)((long)__s + 500) = 0x7fffffff;
    *(undefined4 *)((long)__s + 0x1f8) = 0x7fffffff;
    *(undefined4 *)((long)__s + 0x1fc) = 0x7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(uint *)((long)__s + 0x248) = (uint)*(byte *)((long)__s + 0x24b) << 0x18 | 0xf0904;
    *(uint *)((long)__s + 0x24c) = (uint)*(byte *)((long)__s + 0x24f) << 0x18 | 0xf0904;
    if (*(int *)(lVar23 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar11 << 0x1a | uVar36 << 0x14 | (uint)uVar2;
    }
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rc_base");
    }
  }
  cfgs = *(MppDevRegOffCfgs **)((long)hal + 0x38);
  s = task->packet;
  frame = task->frame;
  pvVar18 = mpp_frame_get_buffer(frame);
  pvVar5 = task->output;
  local_3c = mpp_frame_get_fmt(frame);
  RVar14 = mpp_frame_get_hor_stride(frame);
  RVar15 = mpp_frame_get_ver_stride(frame);
  local_58 = CONCAT44(extraout_var,RVar15);
  iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu580_io_buf");
  sVar19 = mpp_packet_get_length(s);
  local_38 = mpp_buffer_get_size_with_caller(pvVar5,"setup_vepu580_io_buf");
  iVar16 = mpp_buffer_get_fd_with_caller(pvVar5,"setup_vepu580_io_buf");
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_io_buf");
  }
  *(int *)((long)__s + 0x60) = iVar30;
  *(int *)((long)__s + 100) = iVar30;
  *(int *)((long)__s + 0x68) = iVar30;
  *(int *)((long)__s + 0x94) = iVar16;
  *(int *)((long)__s + 0x98) = iVar16;
  *(int *)((long)__s + 0x9c) = iVar16;
  *(int *)((long)__s + 0x90) = iVar16;
  if ((local_3c & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    RVar15 = 0;
    goto switchD_00223c3e_caseD_8;
  }
  RVar15 = 0;
  offset = 0;
  if (MPP_FMT_AYUV1BPP < (local_3c & 0xfffc) || (local_3c & 0xf0000) != MPP_FMT_YUV420SP)
  goto switchD_00223c3e_caseD_8;
  vepu541_set_fmt(&local_80,local_3c);
  RVar15 = 0;
  offset = 0;
  iVar30 = (int)local_58;
  switch(local_80.format) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
  case VEPU580_FMT_YUV444SP:
    RVar15 = iVar30 * RVar14;
    goto LAB_00223c5d;
  case VEPU541_FMT_YUV422P:
    RVar15 = (int)(iVar30 * RVar14 * 3) / 2;
    goto LAB_00223c9c;
  case VEPU541_FMT_YUV420P:
    iVar16 = iVar30 * RVar14 * 5;
    iVar34 = iVar30 * RVar14 * 5 + 3;
    if (-1 < iVar16) {
      iVar34 = iVar16;
    }
    RVar15 = iVar34 >> 2;
LAB_00223c9c:
    offset = iVar30 * RVar14;
    break;
  case VEPU541_FMT_YUYV422:
  case VEPU541_FMT_UYVY422:
  case VEPU540_FMT_YUV400:
  case VEPU540_FMT_BUTT:
    break;
  case VEPU580_FMT_YUV444P:
    RVar15 = iVar30 * RVar14 * 2;
LAB_00223c5d:
    offset = iVar30 * RVar14;
    break;
  default:
    offset = 0;
  }
switchD_00223c3e_caseD_8:
  mpp_dev_multi_offset_update(cfgs,0xa1,offset);
  mpp_dev_multi_offset_update(cfgs,0xa2,RVar15);
  mpp_dev_multi_offset_update(cfgs,0xac,(RK_U32)local_38);
  mpp_dev_multi_offset_update(cfgs,0xaf,(RK_U32)sVar19);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_io_buf");
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_roi");
  }
  puVar6 = *(undefined8 **)((long)hal + 0x118);
  if (puVar6 != (undefined8 *)0x0) {
    uVar12 = (*(int *)(*hal + 0x10) + 0x3f >> 4 & 0x3ffffffcU) *
             (*(int *)(*hal + 0xc) + 0x3f >> 4 & 0xfffffffcU);
    sVar19 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar6,"setup_vepu580_roi");
    if (sVar19 < uVar12 * 8) {
      _mpp_log_l(2,"hal_h264e_vepu580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar30 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar6,"setup_vepu580_roi");
      *(int *)((long)__s + 0xa8) = iVar30;
    }
    if ((*(byte *)(puVar6 + 4) & 1) != 0) {
      sVar19 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[1],"setup_vepu580_roi");
      if (sVar19 < uVar12 * 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar30 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[1],"setup_vepu580_roi");
        *(int *)((long)__s + 0xac) = iVar30;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar6 + 4) & 2) != 0) {
      sVar19 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[2],"setup_vepu580_roi");
      if (sVar19 < uVar12 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar30 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[2],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb0) = iVar30;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar6 + 4) & 4) != 0) {
      sVar19 = mpp_buffer_get_size_with_caller((MppBuffer)puVar6[3],"setup_vepu580_roi");
      if (sVar19 < uVar12 * 0x60 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar30 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar6[3],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb4) = iVar30;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_roi");
  }
  lVar31 = *(long *)((long)hal + 0x78);
  bufs = *(HalBufs *)((long)hal + 0x18);
  RVar14 = *(RK_U32 *)((long)hal + 0x20);
  pHVar20 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar31 + 4));
  pHVar21 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar31 + 8));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_recn_refr");
  }
  if ((pHVar20 != (HalBuf *)0x0) && (pHVar20->cnt != 0)) {
    pvVar5 = *pHVar20->buf;
    pvVar18 = pHVar20->buf[1];
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar5,"setup_vepu580_recn_refr");
    if (((pvVar5 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x66c), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar18 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x66d), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_002259ab;
    *(int *)((long)__s + 0x6c) = iVar30;
    *(int *)((long)__s + 0x70) = iVar30;
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x84) = iVar30;
  }
  if ((pHVar21 != (HalBuf *)0x0) && (pHVar21->cnt != 0)) {
    pvVar5 = *pHVar21->buf;
    pvVar18 = pHVar21->buf[1];
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar5,"setup_vepu580_recn_refr");
    if (((pvVar5 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x679), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar18 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x67a), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_002259ab;
    *(int *)((long)__s + 0x74) = iVar30;
    *(int *)((long)__s + 0x78) = iVar30;
    iVar30 = mpp_buffer_get_fd_with_caller(pvVar18,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x88) = iVar30;
  }
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,RVar14);
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa6,RVar14);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_recn_refr");
  }
  lVar31 = local_50;
  if (task->md_info == (MppBuffer)0x0) {
    iVar30 = 0;
  }
  else {
    iVar30 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu580_gen_regs");
  }
  *(int *)((long)__s + 0x8c) = iVar30;
  *(uint *)((long)__s + 0xe0) =
       (*(uint *)((long)__s + 0xe0) & 0xfffffff7) + (uint)(task->md_info != (MppBuffer)0x0) * 8;
  RVar14 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0xc000ffff | (RVar14 & 0x3fff) << 0x10;
  RVar14 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xffffc000 | RVar14 & 0x3fff;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_split");
  }
  iVar30 = *(int *)(lVar31 + 0xe94);
  if (iVar30 == 2) {
    iVar30 = *(int *)(lVar31 + 0xc);
    iVar16 = *(int *)(lVar31 + 0x10);
    uVar12 = *(uint *)(lVar31 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar31 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar34 = *(int *)(lVar31 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar34 != 0) << 0x1e;
    if (((*(byte *)(lVar31 + 0xe9c) & 1) != 0) ||
       ((iVar34 != 0 && (0x20 < (((iVar16 + 0xf >> 4) * (iVar30 + 0xf >> 4) + uVar12) - 1) / uVar12)
        ))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar30 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar31 + 0xe98) & 0xfffff;
    uVar12 = (uint)(*(int *)(lVar31 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar12;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar12 >> 0x1b;
  }
  else if (iVar30 == 0) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","invalide slice split mode %d\n","setup_vepu580_split");
  }
  *(undefined4 *)(lVar31 + 0xe90) = 0;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_split");
  }
  iVar30 = piVar3[7];
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_me");
  }
  lVar31 = local_50;
  uVar12 = 0xc;
  if (iVar30 < 0x14) {
    if ((iVar30 - 0xbU < 3) || (iVar30 != 10)) {
LAB_00224455:
      uVar12 = 0x1c;
    }
  }
  else if (iVar30 != 99) goto LAB_00224455;
  uVar25 = piVar3[0xf] * 2 + 1;
  uVar11 = 0x2f0b;
  if ((int)uVar25 < 0x2c) {
    uVar11 = piVar3[0xf] * 2 + 4;
    if (-1 < (int)uVar25) {
      uVar11 = uVar25;
    }
    uVar11 = uVar11 >> 2 & 0xf | 0x2f00;
  }
  uVar36 = uVar12 >> 2;
  uVar26 = piVar3[0x10] * 0x10 + 0x3fU & 0xffffffc0;
  uVar25 = uVar26 + 0x7f;
  if (-1 < (int)uVar26) {
    uVar25 = uVar26;
  }
  iVar30 = (int)uVar25 >> 7;
  uVar25 = iVar30 << 4;
  if (uVar36 == iVar30 * 4 || SBORROW4(uVar36,iVar30 * 4) != (int)(uVar36 + iVar30 * -4) < 0) {
    uVar25 = uVar12;
  }
  *(uint *)((long)__s + 0x150) = uVar25 << 2 & 0xf0 | *(uint *)((long)__s + 0x150) & 0xc000 | uVar11
  ;
  uVar12 = (uint)*(ushort *)((long)__s + 0x156) * 0x10000;
  uVar36 = uVar12 + 0x505;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    uVar36 = uVar12;
  }
  *(uint *)((long)__s + 0x154) = uVar36;
  iVar30 = 0x20000;
  if (piVar3[7] < 0x15) {
    iVar30 = (uint)(10 < piVar3[7]) << 0x10;
  }
  *(uint *)((long)__s + 0x154) = iVar30 + (uVar36 & 0x46300505) + 0x80000;
  uVar12 = *(uint *)((long)__s + 0x160);
  uVar36 = uVar11 & 0xf;
  uVar26 = (uVar12 & 0x1fff) + uVar36 * -4;
  if ((int)uVar26 < 0) {
    uVar27 = uVar26 - 0xf;
    if ((int)(uVar26 - 0xf) < 0) {
      uVar27 = uVar26;
    }
    uVar26 = (int)uVar27 >> 4;
  }
  else {
    uVar26 = uVar26 >> 4;
  }
  uVar28 = (piVar3[0xf] * 0x10 + 0x3f >> 6) - 1;
  uVar27 = uVar28;
  if ((int)uVar26 < (int)uVar28) {
    uVar27 = uVar26;
  }
  if ((int)uVar26 < 0) {
    uVar27 = 0;
  }
  if ((int)(((uVar12 & 0x1fff) + uVar36 * 4 + 0xf >> 4) + uVar28) < 0) {
    uVar28 = 0;
  }
  uVar27 = (uVar28 - uVar27) * 0x40 + 0x40;
  uVar26 = 0x40000;
  if (uVar27 != 0) {
    uVar26 = (uVar27 & 0x7fc0) << 0xc;
  }
  uVar27 = *(uint *)((long)__s + 0x158);
  *(uint *)((long)__s + 0x158) = uVar27 & 0xf803ffff | uVar26;
  uVar11 = (uVar12 & 0xf) + (uVar11 & 3) * -4;
  if ((int)uVar11 < 0) {
    iVar30 = (int)uVar11 % 0x10 + uVar36 * 8 + 0x10;
  }
  else {
    iVar30 = (uVar11 & 0xf) + uVar36 * 8;
  }
  uVar36 = iVar30 + 0xfU >> 4;
  uVar28 = uVar12 >> 0x10 & 3;
  uVar25 = (uVar25 << 2) >> 1 & 0x78;
  uVar41 = uVar28 + uVar25 + 3 >> 2;
  uVar11 = uVar26 >> 0x12;
  uVar12 = uVar36 + 1;
  if (uVar11 <= uVar36) {
    uVar12 = uVar11;
  }
  uVar36 = uVar41 + 1;
  uVar33 = uVar26 >> 0x10;
  if (uVar28 == 0 && uVar25 == 0) {
    iVar30 = 1;
  }
  else {
    iVar42 = uVar41 + (uVar41 == 0);
    iVar34 = -uVar33;
    iVar16 = 1;
    do {
      iVar34 = iVar34 + uVar33;
      iVar30 = iVar16;
      if (0x99f < uVar12 * 4 * uVar36 + iVar34) break;
      bVar44 = uVar36 < 3;
      uVar36 = uVar36 - 1;
      if (bVar44) {
        uVar36 = 1;
      }
      bVar44 = iVar16 != iVar42;
      iVar30 = iVar42 + 1;
      iVar16 = iVar16 + 1;
    } while (bVar44);
  }
  iVar16 = uVar36 << 2;
  bVar44 = uVar28 == 0 && uVar25 == 0;
  uVar25 = iVar30 + -1 + (uint)bVar44;
  if (bVar44) {
    iVar16 = 0;
  }
  uVar36 = iVar30 + (uint)bVar44;
  if (0x9a0 < iVar16 * uVar12 + uVar33 * uVar25) {
    uVar36 = uVar25;
  }
  *(uint *)((long)__s + 0x158) =
       (uVar36 - 1) * uVar11 + uVar12 & 0x7ff |
       uVar27 & 0xf8030000 | uVar26 | (uVar36 & 0x1f) << 0xb;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_me");
  }
  if (((local_48->frm).val >> 0x26 & 1) != 0) {
    lVar23 = (long)((local_48->frm).val >> 0x30) % (long)*(int *)(lVar31 + 0xc4);
    iVar30 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
    iVar16 = *(int *)(*(long *)((long)hal + 0x60) + 0x40);
    iVar34 = *(int *)(*hal + 0x16c);
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_intra_refresh");
    }
    if (*(int *)(*hal + 0x164) == 0) {
      uVar40 = 0xfffffffa;
    }
    else {
      iVar35 = (iVar16 + 3U & 0x3ffffffc) * (iVar30 + 3U & 0xfffffffc);
      iVar42 = iVar35 * 8;
      if (SBORROW4(*(int *)((long)hal + 0x130),iVar42) !=
          *(int *)((long)hal + 0x130) + iVar35 * -8 < 0) {
        if (*(long *)((long)hal + 0x120) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x120),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu580","setup_vepu580_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x128) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x120),(MppBuffer *)((long)hal + 0x128),
                   (long)iVar42,"hal_h264e_vepu580","setup_vepu580_intra_refresh");
        *(int *)((long)hal + 0x130) = iVar42;
      }
      if ((*(long *)((long)hal + 0x128) == 0) &&
         (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->roi_base_cfg_buf","setup_vepu580_intra_refresh",0x5ea),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_002259ab;
      iVar42 = mpp_buffer_get_fd_with_caller
                         (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
      pvVar22 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
      if (iVar35 != 0) {
        lVar31 = 0;
        do {
          *(undefined8 *)((long)pvVar22 + lVar31 * 8) = 0x4000000000000000;
          lVar31 = lVar31 + 1;
        } while (iVar35 != (int)lVar31);
      }
      ptr = (ushort *)mpp_osal_calloc("setup_vepu580_intra_refresh",0x10);
      uVar12 = 0;
      if (ptr == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu580_intra_refresh");
        uVar12 = 0xfffffffc;
      }
      iVar30 = iVar30 << 4;
      iVar16 = iVar16 << 4;
      iVar35 = (int)lVar23;
      sVar39 = (short)lVar23;
      sVar9 = (short)iVar34;
      if (*(int *)(*hal + 0x168) == 1) {
        ptr[1] = 0;
        ptr[3] = (ushort)iVar16;
        if (iVar35 == 0) {
          *ptr = 0;
          sVar39 = (short)(iVar34 << 4);
        }
        else {
          *ptr = sVar39 * sVar9 * 0x10 - 0x20;
          sVar39 = sVar9 * 0x10 + 0x20;
        }
        uVar25 = 1;
        uVar11 = 0xfffffff0;
        lVar31 = 4;
LAB_002249f7:
        *(short *)((long)ptr + lVar31) = sVar39;
        *(uint *)((long)__s + 0x150) = uVar11 & *(uint *)((long)__s + 0x150) | uVar25;
      }
      else if (*(int *)(*hal + 0x168) == 0) {
        *ptr = 0;
        ptr[2] = (ushort)iVar30;
        if (iVar35 == 0) {
          ptr[1] = 0;
          sVar39 = (short)(iVar34 << 4);
        }
        else {
          ptr[1] = sVar39 * sVar9 * 0x10 - 0x20;
          sVar39 = sVar9 * 0x10 + 0x20;
        }
        uVar25 = 0x10;
        uVar11 = 0xffffff0f;
        lVar31 = 6;
        goto LAB_002249f7;
      }
      ptr[4] = 1;
      ptr[5] = -*(short *)(*hal + 0x124);
      ptr[6] = 1;
      ptr[7] = 1;
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      *(int *)((long)__s + 0xa8) = iVar42;
      if (pvVar22 == (void *)0x0 || ptr == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","invalid buf %p roi %p\n","vepu580_h264_set_one_roi",
                   pvVar22,ptr);
      }
      else {
        iVar30 = iVar30 >> 4;
        iVar16 = iVar16 >> 4;
        uVar11 = (uint)(*ptr >> 4);
        uVar25 = (uint)(ptr[1] >> 4);
        iVar42 = (ptr[2] + 0xf >> 4) + uVar11;
        iVar34 = (ptr[3] + 0xf >> 4) + uVar25;
        if (iVar30 <= iVar42) {
          iVar42 = iVar30;
        }
        if (iVar16 <= iVar34) {
          iVar34 = iVar16;
        }
        if (*ptr < 0x10) {
          uVar11 = 0;
        }
        if (ptr[1] < 0x10) {
          uVar25 = 0;
        }
        if (((iVar42 <= (int)uVar11) &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_x_end > pos_x_init","vepu580_h264_set_one_roi",0x5b7),
            (mpp_debug._3_1_ & 0x10) != 0)) ||
           ((iVar34 <= (int)uVar25 &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_y_end > pos_y_init","vepu580_h264_set_one_roi",0x5b8),
            (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_002259ab:
          abort();
        }
        if ((int)uVar25 < iVar34) {
          uVar36 = iVar30 + 3U & 0xfffffffc;
          pvVar22 = (void *)((long)pvVar22 + (long)(int)(uVar25 * uVar36 + uVar11) * 8);
          iVar30 = 0;
          do {
            if (0 < (int)(iVar42 - uVar11)) {
              lVar31 = 0;
              do {
                *(undefined8 *)((long)pvVar22 + lVar31 * 8) = 0x2000000000000000;
                lVar31 = lVar31 + 1;
              } while (iVar42 - uVar11 != (int)lVar31);
            }
            iVar30 = iVar30 + 1;
            pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar36 * 8);
          } while (iVar30 != iVar34 - uVar25);
        }
      }
      mpp_osal_free("setup_vepu580_intra_refresh",ptr);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x128),0,"setup_vepu580_intra_refresh");
      uVar40 = (ulong)uVar12;
      lVar31 = local_50;
    }
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_intra_refresh",uVar40);
    }
  }
  if ((((*(int *)(lVar31 + 0x1868) == 0) || ((local_48->info).complex_scene != 0)) ||
      (*(int *)(lVar31 + 0x94) != 4)) || (*(int *)(lVar31 + 0x1864) != 1)) goto LAB_00224e3c;
  lVar31 = *hal;
  iVar30 = (*(int *)(lVar31 + 0x10) + 0xf >> 4) * (*(int *)(lVar31 + 0xc) + 0x3f >> 4 & 0xfffffffcU)
  ;
  *(int *)((long)hal + 0x188) = iVar30 * 8;
  *(int *)((long)hal + 0x18c) = iVar30 * 2;
  *(int *)((long)hal + 400) = iVar30;
  if (*(int *)(lVar31 + 0x1868) == 0) {
    uVar43 = 0;
    _mpp_log_l(4,"hal_h264e_vepu580","deblurring is closed!\n",(char *)0x0);
    bVar44 = true;
  }
  else {
    if ((*(long *)((long)hal + 0x170) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x170),(long)(iVar30 * 8),
                   "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x170) == (MppBuffer)0x0)) {
      fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
    }
    else {
      if ((*(long *)((long)hal + 0x178) != 0) ||
         (mpp_buffer_get_with_tag
                    ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x178),(long)(iVar30 * 2),
                     "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
         *(MppBuffer *)((long)hal + 0x178) != (MppBuffer)0x0)) {
        uVar43 = 0;
        bVar44 = true;
        if (*(long *)((long)hal + 0x180) == 0) {
          pvVar22 = mpp_osal_malloc("setup_vepu580_qpmap_buf",(long)iVar30);
          *(void **)((long)hal + 0x180) = pvVar22;
          bVar44 = true;
          if (pvVar22 == (void *)0x0) {
            bVar44 = false;
            _mpp_log_l(2,"hal_h264e_vepu580","md_flag_buf malloc fail, qpmap invalid\n",(char *)0x0)
            ;
            uVar43 = 0xfffffffa;
          }
        }
        goto LAB_00224de5;
      }
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
    }
    bVar44 = false;
    _mpp_log_l(2,"hal_h264e_vepu580",fmt,(char *)0x0);
    uVar43 = 0xfffffffa;
  }
LAB_00224de5:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_qpmap_buf",uVar43);
  }
  lVar31 = local_50;
  if (!bVar44) {
    _mpp_log_l(2,"hal_h264e_vepu580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00224e3c:
  vepu580_set_osd((Vepu541OsdCfg *)((long)hal + 0x138));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_l2");
  }
  *(undefined4 *)((long)__s + 0x3bc) = 0;
  *(undefined4 *)((long)__s + 0x488) = 0;
  memcpy((void *)((long)__s + 0x4bc),h264e_lambda_default + 6,0xd0);
  memset((void *)((long)__s + 0x3bc),0,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(uint *)((long)__s + 700) = *(uint *)((long)__s + 700) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c0) = *(uint *)((long)__s + 0x2c0) & 0xf000f000 | 0x240009;
  *(uint *)((long)__s + 0x2c4) = *(uint *)((long)__s + 0x2c4) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c8) = *(uint *)((long)__s + 0x2c8) & 0xf000f000 | 0x240009;
  *(uint *)((long)__s + 0x2cc) = *(uint *)((long)__s + 0x2cc) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2d0) = *(uint *)((long)__s + 0x2d0) & 0xf000f000 | 0x240009;
  *(uint *)((long)__s + 0x2d4) = *(uint *)((long)__s + 0x2d4) & 0xfffff000;
  *(undefined4 *)((long)__s + 0x2d8) = 0x30283c30;
  *(undefined4 *)((long)__s + 0x2dc) = 0x30283c30;
  *(undefined4 *)((long)__s + 0x2e0) = 0x30283c30;
  *(undefined4 *)((long)__s + 0x2e4) = 0x201c2a24;
  uVar12 = *(uint *)((long)__s + 0x2ec);
  *(uint *)((long)__s + 0x2ec) = uVar12 & 0xfff003ff | 0x2ac00;
  bVar44 = *(int *)(lVar4 + 0x2c) == 2;
  uVar25 = 0x247;
  if (bVar44) {
    uVar25 = 0x2ab;
  }
  uVar11 = 0x100004;
  if (bVar44) {
    uVar11 = 0x40001;
  }
  iVar30 = 0x51;
  if (bVar44) {
    iVar30 = 0x24;
  }
  *(uint *)((long)__s + 0x2ec) = uVar12 & 0xfff00000 | 0x2ac00 | uVar25;
  *(uint *)((long)__s + 0x2fc) = *(uint *)((long)__s + 0x2fc) & 0xf000f000 | uVar11;
  *(uint *)((long)__s + 0x300) = (*(uint *)((long)__s + 0x300) & 0xffc0f000) + iVar30 + 0x2d0000;
  bVar44 = *(int *)(lVar4 + 0x2c) != 2;
  uVar12 = 0x101010;
  if (bVar44) {
    uVar12 = 0x101419;
  }
  uVar25 = 0x121419;
  if (!bVar44) {
    uVar25 = 0x141516;
  }
  uVar11 = 0x101214;
  if (bVar44) {
    uVar11 = 0x101419;
  }
  *(uint *)((long)__s + 0x30c) = (uint)*(byte *)((long)__s + 0x30f) << 0x18 | uVar12;
  *(uint *)((long)__s + 0x310) = (uint)*(byte *)((long)__s + 0x313) << 0x18 | uVar25;
  *(uint *)((long)__s + 0x314) = (uint)*(byte *)((long)__s + 0x317) << 0x18 | uVar11;
  *(uint *)((long)__s + 0x31c) = *(uint *)((long)__s + 0x31c) & 0xfffffcf8 | 0x306;
  *(uint *)((long)__s + 800) = *(uint *)((long)__s + 800) & 0xe0080200 | 0x8014020;
  *(uint *)((long)__s + 0x324) = *(uint *)((long)__s + 0x324) & 0xfc00fc00 | 0x80004;
  *(uint *)((long)__s + 0x328) = *(uint *)((long)__s + 0x328) & 0xfc00fc00 | 0x180018;
  *(uint *)((long)__s + 0x32c) = *(uint *)((long)__s + 0x32c) & 0xf0f0f000 | 0x8030032;
  *(uint *)((long)__s + 0x330) = *(uint *)((long)__s + 0x330) & 0xc0000000 | 0x8008004;
  *(uint *)((long)__s + 0x334) = *(uint *)((long)__s + 0x334) & 0xfffff000 | 2;
  *(uint *)((long)__s + 0x338) = *(uint *)((long)__s + 0x338) & 0xfff0ffff | 0x10000;
  if (*(int *)(lVar4 + 0x2c) == 2) {
    lVar23 = 0;
    do {
      *(undefined1 *)((long)__s + lVar23 + 0x21c) = *(undefined1 *)(lVar31 + 0x198 + lVar23 * 4);
      *(byte *)((long)__s + lVar23 + 0x22c) = *(byte *)(lVar31 + 0x218 + lVar23 * 4) & 0x3f;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x10);
  }
  else {
    lVar23 = 0;
    do {
      *(undefined1 *)((long)__s + lVar23 + 0x21c) = *(undefined1 *)(lVar31 + 0x1d8 + lVar23 * 4);
      *(byte *)((long)__s + lVar23 + 0x22c) = *(byte *)(lVar31 + 600 + lVar23 * 4) & 0x3f;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0x10);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_l2");
  }
  if (*(MppBuffer *)((long)hal + 0x1f0) == (MppBuffer)0x0) {
    *(undefined4 *)((long)__s + 0xbc) = 0;
  }
  else {
    iVar30 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x1f0),"setup_vepu580_ext_line_buf");
    RVar14 = *(RK_U32 *)((long)hal + 0x58);
    *(int *)((long)__s + 0xb8) = iVar30;
    *(int *)((long)__s + 0xbc) = iVar30;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xb6,RVar14);
    if (disable_rcb_buf == 0) {
      local_80.alpha_swap = RVar14;
      local_80.format = 0xb7;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&local_80);
      local_80.format = 0xb6;
      local_80.alpha_swap = 0;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&local_80);
    }
  }
  plVar7 = *(long **)((long)hal + 0x168);
  if (plVar7 != (long *)0x0) {
    plVar8 = (long *)*plVar7;
    lVar31 = *plVar8;
    lVar23 = plVar8[0x3a];
    bVar44 = *(int *)(lVar31 + 0x1864) != 1;
    lVar4 = plVar8[0x3d];
    *(uint *)((long)plVar7 + 0xc) = (uint)bVar44;
    uVar12 = (int)plVar7[1] + (uint)bVar44 * 2;
    if (uVar12 < 4) {
      if (*(int *)(lVar4 + 0x2c) != 2) {
        if ((int)plVar7[1] == 0) {
          pRVar37 = h264e_klut_weight + 4;
          if (*(int *)(lVar31 + 0x94) == 4) {
            pRVar37 = h264e_klut_weight;
          }
        }
        else {
          pRVar37 = h264e_klut_weight;
        }
        pRVar38 = (RK_U32 *)(lVar23 + 0x25c);
        for (lVar32 = 0x18; lVar32 != 0; lVar32 = lVar32 + -1) {
          *pRVar38 = *pRVar37;
          pRVar37 = pRVar37 + (ulong)bVar45 * -2 + 1;
          pRVar38 = pRVar38 + (ulong)bVar45 * -2 + 1;
        }
      }
      *(uint *)(lVar23 + 0x248) = (uint)*(byte *)(lVar23 + 0x24b) << 0x18 | 0xf0904;
      *(uint *)(lVar23 + 0x24c) = (uint)*(byte *)(lVar23 + 0x24f) << 0x18 | 0xf0904;
      if ((int)plVar7[1] != 0) {
        *(uint *)(lVar23 + 0x2d4) = *(uint *)(lVar23 + 0x2d4) & 0xfffff000 | 0x9c5;
        *(uint *)(lVar23 + 0x2ec) = *(uint *)(lVar23 + 0x2ec) & 0xfff003ff | 0x55400;
        *(uint *)(lVar23 + 0x184) = *(uint *)(lVar23 + 0x184) & 0xf000f000;
        *(byte *)(lVar23 + 600) = *(byte *)(lVar23 + 600) & 0xf8;
        *(byte *)(lVar23 + 0x182) = *(byte *)(lVar23 + 0x182) & 0xf7;
        *(byte *)(lVar23 + 0x58c) = *(byte *)(lVar23 + 0x58c) & 0xfe;
        *(uint *)(lVar23 + 0x300) = *(uint *)(lVar23 + 0x300) & 0xffc0ffff | 0x330000;
        *(byte *)(lVar23 + 0x31c) = *(byte *)(lVar23 + 0x31c) & 0xfb;
        *(uint *)(lVar23 + 0x32c) = *(uint *)(lVar23 + 0x32c) & 0xfffff000;
        *(uint *)(lVar23 + 0x334) = *(uint *)(lVar23 + 0x334) & 0xfffff000;
        *(uint *)(lVar23 + 0x338) = *(uint *)(lVar23 + 0x338) & 0xfff0ffff | 0x80000;
      }
      *(uint *)(lVar23 + 0x658) = *(uint *)(lVar23 + 0x658) & 0xf000f000 | 0x2c001c;
      *(uint *)(lVar23 + 0x65c) = *(uint *)(lVar23 + 0x65c) & 0xfffff000 | 0x48;
      *(uint *)(lVar23 + 0x670) =
           (intra_atf_wgt[uVar12][2] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar12][1] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x673) << 0x18 | (uint)(byte)intra_atf_wgt[uVar12][0];
      *(uint *)(lVar23 + 0x674) =
           (intra_atf_wgt[uVar12][5] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar12][4] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x677) << 0x18 | (uint)(byte)intra_atf_wgt[uVar12][3];
      *(uint *)(lVar23 + 0x678) =
           (intra_atf_wgt[uVar12][8] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar12][7] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x67b) << 0x18 | (uint)(byte)intra_atf_wgt[uVar12][6];
      *(uint *)(lVar23 + 0x67c) =
           (intra_atf_wgt[uVar12][0xb] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar12][10] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x67f) << 0x18 | (uint)(byte)intra_atf_wgt[uVar12][9];
      *(uint *)(lVar23 + 0x6a8) = *(uint *)(lVar23 + 0x6a8) & 0xf000f000 | 0x8000a;
      *(uint *)(lVar23 + 0x6ac) = *(uint *)(lVar23 + 0x6ac) & 0xf000f000 | 0x19000f;
      *(uint *)(lVar23 + 0x6c0) =
           (skip_atf_wgt[uVar12][2] & 0xffU) << 0x10 |
           (skip_atf_wgt[uVar12][1] & 0xffU) << 8 | (uint)(byte)skip_atf_wgt[uVar12][0] |
           skip_atf_wgt[uVar12][3] << 0x18;
      *(uint *)(lVar23 + 0x6c4) =
           (skip_atf_wgt[uVar12][6] & 0xffU) << 0x10 |
           (skip_atf_wgt[uVar12][5] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x6c7) << 0x18 | (uint)(byte)skip_atf_wgt[uVar12][4];
      *(uint *)(lVar23 + 0x6c8) =
           (skip_atf_wgt[uVar12][9] & 0xffU) << 0x10 |
           (skip_atf_wgt[uVar12][8] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x6cb) << 0x18 | (uint)(byte)skip_atf_wgt[uVar12][7];
      *(uint *)(lVar23 + 0x6cc) =
           (skip_atf_wgt[uVar12][0xc] & 0xffU) << 0x10 |
           (skip_atf_wgt[uVar12][0xb] & 0xffU) << 8 |
           (uint)*(byte *)(lVar23 + 0x6cf) << 0x18 | (uint)(byte)skip_atf_wgt[uVar12][10];
      if (*(int *)(lVar4 + 0x2c) != 2) {
        *(uint *)(lVar23 + 0x30c) =
             (atr_wgt[uVar12][2] & 0xffU) << 0x10 |
             (atr_wgt[uVar12][1] & 0xffU) << 8 |
             (uint)*(byte *)(lVar23 + 0x30f) << 0x18 | (uint)(byte)atr_wgt[uVar12][0];
        *(uint *)(lVar23 + 0x310) =
             (atr_wgt[uVar12][5] & 0xffU) << 0x10 |
             (atr_wgt[uVar12][4] & 0xffU) << 8 |
             (uint)*(byte *)(lVar23 + 0x313) << 0x18 | (uint)(byte)atr_wgt[uVar12][3];
        *(uint *)(lVar23 + 0x314) =
             (atr_wgt[uVar12][8] & 0xffU) << 0x10 |
             (atr_wgt[uVar12][7] & 0xffU) << 8 |
             (uint)*(byte *)(lVar23 + 0x317) << 0x18 | (uint)(byte)atr_wgt[uVar12][6];
      }
      uVar25 = cime_multi[uVar12][3];
      *(uint *)(lVar23 + 0x324) =
           (cime_multi[uVar12][1] & 0x3ffU) << 0x10 |
           *(uint *)(lVar23 + 0x324) & 0xfc00fc00 | cime_multi[uVar12][0] & 0x3ffU;
      *(uint *)(lVar23 + 0x328) =
           (uVar25 & 0x3ff) << 0x10 |
           *(uint *)(lVar23 + 0x328) & 0xfc00fc00 | cime_multi[uVar12][2] & 0x3ffU;
      *(uint *)(lVar23 + 0x330) =
           (rime_multi[uVar12][2] & 0x3ffU) << 0x14 |
           *(uint *)(lVar23 + 0x330) & 0xc0000000 | (ushort)rime_multi[uVar12][0] & 0xc00003ff |
           (rime_multi[uVar12][1] & 0x3ffU) << 10;
      if (*(int *)(lVar31 + 0x18c) != 0) {
        uVar12 = 0x2ab;
        if (*(uint *)(lVar31 + 0x184) != 0) {
          uVar12 = *(uint *)(lVar31 + 0x184) & 0x3ff;
        }
        uVar25 = *(uint *)(lVar23 + 0x2ec);
        *(uint *)(lVar23 + 0x2ec) = uVar25 & 0xfffffc00 | uVar12;
        uVar11 = 0x55400;
        if (*(uint *)(lVar31 + 0x188) != 0) {
          uVar11 = (*(uint *)(lVar31 + 0x188) & 0x3ff) << 10;
        }
        *(uint *)(lVar23 + 0x2ec) = uVar25 & 0xfff00000 | uVar12 | uVar11;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h264e_tune_reg_patch");
    }
  }
  if (((ulong)local_48->frm & 4) != 0) {
    uVar25 = *(int *)(*hal + 0xc) + 0x3fU & 0xffffffc0;
    uVar12 = *(int *)(*hal + 0x10) + 0xfU & 0xfffffff0;
    if ((*(long *)((long)hal + 0x198) == 0) &&
       (iVar30 = uVar12 * uVar25,
       mpp_buffer_get_with_tag
                 ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x198),
                  (long)((iVar30 >> 1) + iVar30),"hal_h264e_vepu580",
                  "vepu580_h264e_save_pass1_patch"),
       *(MppBuffer *)((long)hal + 0x198) == (MppBuffer)0x0)) {
      _mpp_log_l(2,"hal_h264e_vepu580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 4;
      iVar30 = mpp_buffer_get_fd_with_caller
                         (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_save_pass1_patch");
      *(int *)((long)__s + 0x6c) = iVar30;
      *(int *)((long)__s + 0x70) = iVar30;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) | 0x80;
      mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,uVar12 * uVar25);
      *(byte *)((long)__s + 0x140) = *(byte *)((long)__s + 0x140) & 0xfe;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
    }
  }
  if (((ulong)local_48->frm & 8) != 0) {
    uVar12 = *(int *)(*hal + 0xc) + 0x3f;
    RVar14 = (*(int *)(*hal + 0x10) + 0xfU & 0x3fffff0) * (uVar12 & 0xffffffc0);
    iVar30 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_use_pass1_patch");
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","vepu580_h264e_use_pass1_patch");
    }
    *(uint *)((long)__s + 0xf8) = *(uint *)((long)__s + 0xf8) & 0xffffff40 | 0x98;
    *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | uVar12 & 0x1ffc0;
    *(ushort *)((long)__s + 0x118) = (ushort)uVar12 & 0xffc0;
    *(byte *)((long)__s + 0x10f) = *(byte *)((long)__s + 0x10f) & 0x83;
    *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xc000c000;
    *(int *)((long)__s + 0x60) = iVar30;
    *(int *)((long)__s + 100) = iVar30;
    *(int *)((long)__s + 0x68) = iVar30;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa1,RVar14);
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa2,RVar14);
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","vepu580_h264e_use_pass1_patch");
    }
  }
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    EncRcTask *rc_task = task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu580_normal(regs);
    ret = setup_vepu580_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu580_dual_core(ctx, slice->slice_type);
    setup_vepu580_codec(regs, sps, pps, slice);
    setup_vepu580_rdo_pred(regs, sps, pps, slice);
    setup_vepu580_rdo_cfg(&regs->reg_rdo);
    setup_vepu580_rdo_bias_cfg(&regs->reg_rdo, &cfg->hw);

    // scl cfg
    memcpy(&regs->reg_scl, vepu580_540_h264_flat_scl_tab, sizeof(vepu580_540_h264_flat_scl_tab));

    setup_vepu580_rc_base(regs, ctx, rc_task);
    setup_vepu580_io_buf(regs, ctx->offsets, task);
    setup_vepu580_roi(regs, ctx);
    setup_vepu580_recn_refr(ctx, regs);

    regs->reg_base.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;
    regs->reg_base.enc_pic.mei_stor = task->md_info ? 1 : 0;
    regs->reg_base.pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg_base.pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu580_split(regs, cfg);
    setup_vepu580_me(regs, sps, slice);

    if (frm_status->is_i_refresh)
        setup_vepu580_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != setup_vepu580_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    vepu580_set_osd(&ctx->osd_cfg);
    setup_vepu580_l2(regs, slice, &cfg->hw);
    setup_vepu580_ext_line_buf(regs, ctx);
    vepu580_h264e_tune_reg_patch(ctx->tune);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu580_h264e_save_pass1_patch(regs, ctx);

    if (frm->use_pass1)
        vepu580_h264e_use_pass1_patch(regs, ctx);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}